

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.cpp
# Opt level: O3

void __thiscall Callback::Emitter::SignalActivation::~SignalActivation(SignalActivation *this)

{
  usize *puVar1;
  State SVar2;
  SignalActivation *pSVar3;
  Item *pIVar4;
  Item *pIVar5;
  Item *item;
  Item *pIVar6;
  Item *pIVar7;
  SignalData *pSVar8;
  Iterator *pIVar9;
  
  if (this->invalidated == false) {
    pSVar8 = this->data;
    if (((pSVar8 != (SignalData *)0x0) &&
        (pSVar3 = this->next, pSVar8->activation = pSVar3, pSVar3 == (SignalActivation *)0x0)) &&
       (pSVar8->dirty == true)) {
      pIVar4 = (pSVar8->slots)._end.item;
      pIVar6 = (pSVar8->slots)._begin.item;
      if (pIVar6 != pIVar4) {
        do {
          SVar2 = (pIVar6->value).state;
          if (SVar2 == connecting) {
            (pIVar6->value).state = connected;
LAB_00104d20:
            pIVar7 = pIVar6->next;
          }
          else {
            if (SVar2 != disconnected) goto LAB_00104d20;
            pSVar8 = this->data;
            pIVar5 = pIVar6->prev;
            pIVar7 = pIVar6->next;
            pIVar9 = (Iterator *)&pIVar5->next;
            if (pIVar5 == (Item *)0x0) {
              pIVar9 = &(pSVar8->slots)._begin;
            }
            pIVar9->item = pIVar7;
            pIVar7->prev = pIVar5;
            puVar1 = &(pSVar8->slots)._size;
            *puVar1 = *puVar1 - 1;
            pIVar6->prev = (pSVar8->slots).freeItem;
            (pSVar8->slots).freeItem = pIVar6;
          }
          pIVar6 = pIVar7;
        } while (pIVar7 != pIVar4);
        pSVar8 = this->data;
      }
      pSVar8->dirty = false;
      return;
    }
  }
  else if (this->next != (SignalActivation *)0x0) {
    this->next->invalidated = true;
    return;
  }
  return;
}

Assistant:

Callback::Emitter::SignalActivation::~SignalActivation()
{
  if(!invalidated)
  {
    if(data && !(data->activation = next) && data->dirty)
    {
      for(List<Slot>::Iterator i = data->slots.begin(), end = data->slots.end(); i != end;)
        switch(i->state)
        {
        case Slot::disconnected:
          i = data->slots.remove(i);
          break;
        case Slot::connecting:
          i->state = Slot::connected;
        default:
          ++i;
        }
      data->dirty = false;
    }
  }
  else if(next)
    next->invalidated = true;
}